

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::UpdateDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *tgtInfo,bool verbose,bool color)

{
  cmMakefile *pcVar1;
  string_view sVar2;
  bool bVar3;
  byte bVar4;
  Encoding EVar5;
  cmake *this_00;
  string *psVar6;
  ulong uVar7;
  cmCMakePath *this_01;
  char *pcVar8;
  string_view binaryDir;
  undefined1 local_1070 [8];
  cmGeneratedFileStream internalRuleFileStream;
  undefined1 local_e00 [8];
  cmGeneratedFileStream ruleFileStream;
  cmAlphaNum local_b68;
  undefined1 local_b38 [8];
  string message_1;
  cmCMakePath local_af8;
  cmCMakePath local_ad0;
  undefined1 local_aa8 [8];
  string targetName_1;
  NotInProjectDir local_a68;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a48;
  allocator<char> local_a21;
  string local_a20;
  string_view local_a00;
  byte local_9e9;
  undefined1 local_9e8 [7];
  bool projectOnly;
  cmDependsCompiler depsManager;
  DependencyMap dependencies;
  string depFile;
  string internalDepFile;
  undefined1 local_958 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depFiles;
  string local_938;
  string local_918 [8];
  string depends;
  cmAlphaNum local_8c8;
  undefined1 local_898 [8];
  string message;
  undefined1 local_858 [8];
  string targetName;
  cmDependsC checker;
  undefined1 local_2c0 [7];
  bool needRescanDependencies;
  DependencyMap validDependencies;
  cmAlphaNum local_260;
  string local_230;
  int local_20c;
  undefined1 local_208 [4];
  int result_1;
  cmAlphaNum local_1d8;
  undefined1 local_1a8 [8];
  string dirInfoFile;
  undefined1 local_180 [7];
  bool needRescanDirInfo;
  cmAlphaNum local_150;
  string local_120;
  int local_fc;
  cmFileTimeCache *pcStack_f8;
  int result;
  cmFileTimeCache *ftc;
  undefined1 local_e8 [7];
  bool needRescanDependInfo;
  string dependFile;
  string internalDependFile;
  string local_a0;
  undefined1 local_80 [8];
  string targetDir;
  bool status;
  allocator<char> local_49;
  string local_48;
  byte local_22;
  byte local_21;
  bool color_local;
  string *psStack_20;
  bool verbose_local;
  string *tgtInfo_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  local_22 = color;
  local_21 = verbose;
  psStack_20 = tgtInfo;
  tgtInfo_local = (string *)this;
  bVar3 = cmMakefile::ReadListFile
                    ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,tgtInfo);
  if ((!bVar3) || (bVar3 = cmSystemTools::GetErrorOccurredFlag(), bVar3)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"Target DependInfo.cmake file not found",&local_49);
    cmSystemTools::Error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  targetDir.field_2._M_local_buf[0xb] = '\x01';
  CheckMultipleOutputs(this,(bool)(local_21 & 1));
  cmsys::SystemTools::GetFilenamePath((string *)local_80,psStack_20);
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"CMAKE_DEPENDS_LANGUAGES",
             (allocator<char> *)(internalDependFile.field_2._M_local_buf + 0xf));
  cmMakefile::GetSafeDefinition(pcVar1,&local_a0);
  bVar4 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)(internalDependFile.field_2._M_local_buf + 0xf));
  if (((bVar4 ^ 0xff) & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dependFile.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/depend.internal");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/depend.make");
    ftc._7_1_ = 0;
    this_00 = cmGlobalGenerator::GetCMakeInstance
                        ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator
                        );
    pcStack_f8 = cmake::GetFileTimeCache(this_00);
    bVar3 = cmFileTimeCache::Compare
                      (pcStack_f8,(string *)((long)&dependFile.field_2 + 8),psStack_20,&local_fc);
    if ((!bVar3) || (local_fc < 0)) {
      if ((local_21 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_150,"Dependee \"");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_180,psStack_20);
        cmStrCat<char[27],std::__cxx11::string,char[4]>
                  (&local_120,&local_150,(cmAlphaNum *)local_180,
                   (char (*) [27])"\" is newer than depender \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dependFile.field_2 + 8),(char (*) [4])0xd55632);
        cmSystemTools::Stdout(&local_120);
        std::__cxx11::string::~string((string *)&local_120);
      }
      ftc._7_1_ = 1;
    }
    dirInfoFile.field_2._M_local_buf[0xf] = '\0';
    psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    cmAlphaNum::cmAlphaNum(&local_1d8,psVar6);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_208,"/CMakeFiles/CMakeDirectoryInformation.cmake");
    cmStrCat<>((string *)local_1a8,&local_1d8,(cmAlphaNum *)local_208);
    bVar3 = cmFileTimeCache::Compare
                      (pcStack_f8,(string *)((long)&dependFile.field_2 + 8),(string *)local_1a8,
                       &local_20c);
    if ((!bVar3) || (local_20c < 0)) {
      if ((local_21 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_260,"Dependee \"");
        cmAlphaNum::cmAlphaNum
                  ((cmAlphaNum *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count
                   ,(string *)local_1a8);
        cmStrCat<char[27],std::__cxx11::string,char[4]>
                  (&local_230,&local_260,
                   (cmAlphaNum *)&validDependencies._M_t._M_impl.super__Rb_tree_header._M_node_count
                   ,(char (*) [27])"\" is newer than depender \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&dependFile.field_2 + 8),(char (*) [4])0xd55632);
        cmSystemTools::Stdout(&local_230);
        std::__cxx11::string::~string((string *)&local_230);
      }
      dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
    }
    std::__cxx11::string::~string((string *)local_1a8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)local_2c0);
    checker.CacheFileName.field_2._M_local_buf[0xf] = '\0';
    if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
      cmDependsC::cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
      cmDepends::SetVerbose((cmDepends *)((long)&targetName.field_2 + 8),(bool)(local_21 & 1));
      cmDepends::SetFileTimeCache((cmDepends *)((long)&targetName.field_2 + 8),pcStack_f8);
      bVar3 = cmDepends::Check((cmDepends *)((long)&targetName.field_2 + 8),(string *)local_e8,
                               (string *)((long)&dependFile.field_2 + 8),(DependencyMap *)local_2c0)
      ;
      checker.CacheFileName.field_2._M_local_buf[0xf] = (bVar3 ^ 0xffU) & 1;
      cmDependsC::~cmDependsC((cmDependsC *)((long)&targetName.field_2 + 8));
    }
    if ((((ftc._7_1_ & 1) != 0) || ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) != 0)) ||
       (checker.CacheFileName.field_2._M_local_buf[0xf] != '\0')) {
      if ((local_21 & 1) != 0) {
        cmsys::SystemTools::GetFilenameName((string *)local_858,(string *)local_80);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)((long)&message.field_2 + 8),(ulong)local_858);
        std::__cxx11::string::operator=
                  ((string *)local_858,(string *)(message.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(message.field_2._M_local_buf + 8));
        cmAlphaNum::cmAlphaNum(&local_8c8,"Scanning dependencies of target ");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&depends.field_2 + 8),(string *)local_858);
        cmStrCat<>((string *)local_898,&local_8c8,(cmAlphaNum *)((long)&depends.field_2 + 8));
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::MakefileColorEcho(0x106,pcVar8,true,(bool)(local_22 & 1));
        std::__cxx11::string::~string((string *)local_898);
        std::__cxx11::string::~string((string *)local_858);
      }
      targetDir.field_2._M_local_buf[0xb] =
           ScanDependencies(this,(string *)local_80,(string *)local_e8,
                            (string *)((long)&dependFile.field_2 + 8),(DependencyMap *)local_2c0);
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)local_2c0);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)(dependFile.field_2._M_local_buf + 8));
  }
  pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_938,"CMAKE_DEPENDS_DEPENDENCY_FILES",
             (allocator<char> *)
             ((long)&depFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_938);
  std::__cxx11::string::string(local_918,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&depFiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    sVar2 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_918);
    cmExpandedList_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_958,sVar2,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&depFile.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/compiler_depend.internal");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                   "/compiler_depend.make");
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
           *)&depsManager.LocalGenerator);
    cmDependsCompiler::cmDependsCompiler((cmDependsCompiler *)local_9e8);
    pcVar1 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a20,"CMAKE_DEPENDS_IN_PROJECT_ONLY",&local_a21);
    psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&local_a20);
    local_a00 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    bVar3 = cmIsOn(local_a00);
    std::__cxx11::string::~string((string *)&local_a20);
    std::allocator<char>::~allocator(&local_a21);
    local_9e9 = bVar3;
    cmDependsCompiler::SetVerbose((cmDependsCompiler *)local_9e8,(bool)(local_21 & 1));
    cmDependsCompiler::SetLocalGenerator((cmDependsCompiler *)local_9e8,this);
    if ((local_9e9 & 1) == 0) {
      std::
      function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function(&local_a48);
    }
    else {
      psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this);
      sVar2 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
      binaryDir = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
      targetName_1.field_2._8_8_ = binaryDir._M_len;
      anon_unknown.dwarf_13a3357::NotInProjectDir::NotInProjectDir(&local_a68,sVar2,binaryDir);
      std::function<bool(std::__cxx11::string_const&)>::
      function<(anonymous_namespace)::NotInProjectDir,void>
                ((function<bool(std::__cxx11::string_const&)> *)&local_a48,&local_a68);
    }
    bVar3 = cmDependsCompiler::CheckDependencies
                      ((cmDependsCompiler *)local_9e8,(string *)((long)&depFile.field_2 + 8),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_958,(DependencyMap *)&depsManager.LocalGenerator,&local_a48);
    std::
    function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function(&local_a48);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
LAB_008b626c:
      internalRuleFileStream._612_4_ = 0;
    }
    else {
      if ((local_21 & 1) != 0) {
        std::__cxx11::string::string
                  ((string *)(message_1.field_2._M_local_buf + 8),(string *)local_80);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  (&local_af8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&message_1.field_2 + 8),generic_format);
        cmCMakePath::GetFileName(&local_ad0,&local_af8);
        this_01 = cmCMakePath::RemoveExtension(&local_ad0);
        cmCMakePath::GenericString_abi_cxx11_((string *)local_aa8,this_01);
        cmCMakePath::~cmCMakePath(&local_ad0);
        cmCMakePath::~cmCMakePath(&local_af8);
        std::__cxx11::string::~string((string *)(message_1.field_2._M_local_buf + 8));
        cmAlphaNum::cmAlphaNum(&local_b68,"Consolidate compiler generated dependencies of target ");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&ruleFileStream.field_0x260,(string *)local_aa8);
        cmStrCat<>((string *)local_b38,&local_b68,(cmAlphaNum *)&ruleFileStream.field_0x260);
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::MakefileColorEcho(0x106,pcVar8,true,(bool)(local_22 & 1));
        std::__cxx11::string::~string((string *)local_b38);
        std::__cxx11::string::~string((string *)local_aa8);
      }
      EVar5 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                _vptr_cmGlobalGenerator[5])();
      cmGeneratedFileStream::cmGeneratedFileStream
                ((cmGeneratedFileStream *)local_e00,
                 (string *)&dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count,false,
                 EVar5);
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_e00,true);
      bVar4 = std::ios::operator!((ios *)(local_e00 + (long)*(_func_int **)((long)local_e00 + -0x18)
                                         ));
      if ((bVar4 & 1) == 0) {
        EVar5 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                  _vptr_cmGlobalGenerator[5])();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_1070,(string *)((long)&depFile.field_2 + 8),false,
                   EVar5);
        bVar4 = std::ios::operator!((ios *)(local_1070 +
                                           (long)*(_func_int **)((long)local_1070 + -0x18)));
        internalRuleFileStream._612_1_ = (bVar4 & 1) != 0;
        if ((bool)internalRuleFileStream._612_1_) {
          this_local._7_1_ = 0;
        }
        else {
          WriteDisclaimer(this,(ostream *)local_e00);
          WriteDisclaimer(this,(ostream *)local_1070);
          cmDependsCompiler::WriteDependencies
                    ((cmDependsCompiler *)local_9e8,(DependencyMap *)&depsManager.LocalGenerator,
                     (ostream *)local_e00,(ostream *)local_1070);
        }
        internalRuleFileStream._613_3_ = 0;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1070);
      }
      else {
        this_local._7_1_ = 0;
        internalRuleFileStream._612_4_ = 1;
      }
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_e00);
      if (internalRuleFileStream._612_4_ == 0) goto LAB_008b626c;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            *)&depsManager.LocalGenerator);
    std::__cxx11::string::~string
              ((string *)&dependencies._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)(depFile.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_958);
    if (internalRuleFileStream._612_4_ != 0) goto LAB_008b62f8;
  }
  this_local._7_1_ = targetDir.field_2._M_local_buf[0xb] & 1;
  internalRuleFileStream._612_4_ = 1;
LAB_008b62f8:
  std::__cxx11::string::~string(local_918);
  std::__cxx11::string::~string((string *)local_80);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmLocalUnixMakefileGenerator3::UpdateDependencies(
  const std::string& tgtInfo, bool verbose, bool color)
{
  // read in the target info file
  if (!this->Makefile->ReadListFile(tgtInfo) ||
      cmSystemTools::GetErrorOccurredFlag()) {
    cmSystemTools::Error("Target DependInfo.cmake file not found");
  }

  bool status = true;

  // Check if any multiple output pairs have a missing file.
  this->CheckMultipleOutputs(verbose);

  std::string const targetDir = cmSystemTools::GetFilenamePath(tgtInfo);
  if (!this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES").empty()) {
    // dependencies are managed by CMake itself

    std::string const internalDependFile = targetDir + "/depend.internal";
    std::string const dependFile = targetDir + "/depend.make";

    // If the target DependInfo.cmake file has changed since the last
    // time dependencies were scanned then force rescanning.  This may
    // happen when a new source file is added and CMake regenerates the
    // project but no other sources were touched.
    bool needRescanDependInfo = false;
    cmFileTimeCache* ftc =
      this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache();
    {
      int result;
      if (!ftc->Compare(internalDependFile, tgtInfo, &result) || result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", tgtInfo,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDependInfo = true;
      }
    }

    // If the directory information is newer than depend.internal, include
    // dirs may have changed. In this case discard all old dependencies.
    bool needRescanDirInfo = false;
    {
      std::string dirInfoFile =
        cmStrCat(this->GetCurrentBinaryDirectory(),
                 "/CMakeFiles/CMakeDirectoryInformation.cmake");
      int result;
      if (!ftc->Compare(internalDependFile, dirInfoFile, &result) ||
          result < 0) {
        if (verbose) {
          cmSystemTools::Stdout(cmStrCat("Dependee \"", dirInfoFile,
                                         "\" is newer than depender \"",
                                         internalDependFile, "\".\n"));
        }
        needRescanDirInfo = true;
      }
    }

    // Check the implicit dependencies to see if they are up to date.
    // The build.make file may have explicit dependencies for the object
    // files but these will not affect the scanning process so they need
    // not be considered.
    cmDepends::DependencyMap validDependencies;
    bool needRescanDependencies = false;
    if (!needRescanDirInfo) {
      cmDependsC checker;
      checker.SetVerbose(verbose);
      checker.SetFileTimeCache(ftc);
      // cmDependsC::Check() fills the vector validDependencies() with the
      // dependencies for those files where they are still valid, i.e.
      // neither the files themselves nor any files they depend on have
      // changed. We don't do that if the CMakeDirectoryInformation.cmake
      // file has changed, because then potentially all dependencies have
      // changed. This information is given later on to cmDependsC, which
      // then only rescans the files where it did not get valid dependencies
      // via this dependency vector. This means that in the normal case, when
      // only few or one file have been edited, then also only this one file
      // is actually scanned again, instead of all files for this target.
      needRescanDependencies =
        !checker.Check(dependFile, internalDependFile, validDependencies);
    }

    if (needRescanDependInfo || needRescanDirInfo || needRescanDependencies) {
      // The dependencies must be regenerated.
      if (verbose) {
        std::string targetName = cmSystemTools::GetFilenameName(targetDir);
        targetName = targetName.substr(0, targetName.length() - 4);
        std::string message =
          cmStrCat("Scanning dependencies of target ", targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      status = this->ScanDependencies(targetDir, dependFile,
                                      internalDependFile, validDependencies);
    }
  }

  auto depends =
    this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_DEPENDENCY_FILES");
  if (!depends.empty()) {
    // dependencies are managed by compiler
    auto depFiles = cmExpandedList(depends, true);
    std::string const internalDepFile =
      targetDir + "/compiler_depend.internal";
    std::string const depFile = targetDir + "/compiler_depend.make";
    cmDepends::DependencyMap dependencies;
    cmDependsCompiler depsManager;
    bool projectOnly = cmIsOn(
      this->Makefile->GetSafeDefinition("CMAKE_DEPENDS_IN_PROJECT_ONLY"));

    depsManager.SetVerbose(verbose);
    depsManager.SetLocalGenerator(this);

    if (!depsManager.CheckDependencies(
          internalDepFile, depFiles, dependencies,
          projectOnly ? NotInProjectDir(this->GetSourceDirectory(),
                                        this->GetBinaryDirectory())
                      : std::function<bool(const std::string&)>())) {
      // regenerate dependencies files
      if (verbose) {
        std::string targetName = cmCMakePath(targetDir)
                                   .GetFileName()
                                   .RemoveExtension()
                                   .GenericString();
        auto message =
          cmStrCat("Consolidate compiler generated dependencies of target ",
                   targetName);
        cmSystemTools::MakefileColorEcho(
          cmsysTerminal_Color_ForegroundMagenta |
            cmsysTerminal_Color_ForegroundBold,
          message.c_str(), true, color);
      }

      // Open the make depends file.  This should be copy-if-different
      // because the make tool may try to reload it needlessly otherwise.
      cmGeneratedFileStream ruleFileStream(
        depFile, false, this->GlobalGenerator->GetMakefileEncoding());
      ruleFileStream.SetCopyIfDifferent(true);
      if (!ruleFileStream) {
        return false;
      }

      // Open the cmake dependency tracking file.  This should not be
      // copy-if-different because dependencies are re-scanned when it is
      // older than the DependInfo.cmake.
      cmGeneratedFileStream internalRuleFileStream(
        internalDepFile, false, this->GlobalGenerator->GetMakefileEncoding());
      if (!internalRuleFileStream) {
        return false;
      }

      this->WriteDisclaimer(ruleFileStream);
      this->WriteDisclaimer(internalRuleFileStream);

      depsManager.WriteDependencies(dependencies, ruleFileStream,
                                    internalRuleFileStream);
    }
  }

  // The dependencies are already up-to-date.
  return status;
}